

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup)

{
  int sgn1_1;
  int nn_1;
  int sgn1;
  int nn;
  int inc;
  int l;
  fft_data *oup_local;
  fft_data *inp_local;
  fft_object obj_local;
  
  if (obj->lt == 0) {
    mixed_radix_dit_rec(oup,inp,obj,obj->sgn,obj->N,1,0);
  }
  else if (obj->lt == 1) {
    bluestein_fft(inp,oup,obj,obj->sgn,obj->N);
  }
  return;
}

Assistant:

void fft_exec(fft_object obj,fft_data *inp,fft_data *oup) {
	if (obj->lt == 0) {
		//fftct_radix3_dit_rec(inp,oup,obj, obj->sgn, obj->N);
		//fftct_mixed_rec(inp,oup,obj, obj->sgn, obj->N);
		//printf("%f \n", 1.785);
		int l,inc;
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		l = 1;
		inc = 0;
		//radix3_dit_rec(oup,inp,obj,sgn1,nn,l);
		mixed_radix_dit_rec(oup,inp,obj,sgn1,nn,l,inc);
	} else if (obj->lt == 1){
		//printf("%f \n", 1.785);
		int nn,sgn1;
		nn = obj->N;
		sgn1 = obj->sgn;
		bluestein_fft(inp,oup,obj,sgn1,nn);

	}

}